

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

char * NameWriteUnsigned(char *pos,uint value)

{
  char *pcVar1;
  char **local_30;
  char *curr;
  char reverse [16];
  char *pcStack_10;
  uint value_local;
  char *pos_local;
  
  local_30 = &curr;
  curr._0_1_ = (char)((ulong)value % 10) + '0';
  reverse._12_4_ = value;
  while (local_30 = (char **)((long)local_30 + 1), reverse._12_4_ = (uint)reverse._12_4_ / 10,
        pcStack_10 = pos, reverse._12_4_ != 0) {
    *(char *)local_30 = (char)((ulong)(uint)reverse._12_4_ % 10) + '0';
  }
  do {
    local_30 = (char **)((long)local_30 + -1);
    pcVar1 = pcStack_10 + 1;
    *pcStack_10 = *(char *)local_30;
    pcStack_10 = pcVar1;
  } while (local_30 != &curr);
  return pcVar1;
}

Assistant:

char* NameWriteUnsigned(char *pos, unsigned value)
{
	char reverse[16];
	char *curr = reverse;

	*curr++ = (char)((value % 10) + '0');

	while(value /= 10)
		*curr++ = (char)((value % 10) + '0');

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != reverse);

	return pos;
}